

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_shar.c
# Opt level: O0

ssize_t archive_write_shar_data_uuencode(archive_write *a,void *buff,size_t length)

{
  shar *shar_00;
  int iVar1;
  int r_1;
  int r;
  int ret;
  size_t n;
  char *src;
  shar *shar;
  size_t length_local;
  void *buff_local;
  archive_write *a_local;
  
  shar_00 = (shar *)a->format_data;
  if (shar_00->has_data == 0) {
    return 0;
  }
  _r = length;
  n = (size_t)buff;
  if (shar_00->outpos != 0) {
    _r = 0x2d - shar_00->outpos;
    if (length < _r) {
      _r = length;
    }
    memcpy(shar_00->outbuff + shar_00->outpos,buff,_r);
    if (shar_00->outpos + _r < 0x2d) {
      shar_00->outpos = _r + shar_00->outpos;
      return length;
    }
    iVar1 = _uuencode_line(a,shar_00,shar_00->outbuff,0x2d);
    if (iVar1 != 0) {
      return -0x1e;
    }
    n = _r + (long)buff;
    _r = length - _r;
  }
  while( true ) {
    if (_r < 0x2d) {
      if (_r != 0) {
        memcpy(shar_00->outbuff,(void *)n,_r);
        shar_00->outpos = _r;
      }
      return length;
    }
    iVar1 = _uuencode_line(a,shar_00,(char *)n,0x2d);
    if (iVar1 != 0) break;
    n = n + 0x2d;
    _r = _r - 0x2d;
    if (0xffff < (shar_00->work).length) {
      iVar1 = __archive_write_output(a,(shar_00->work).s,(shar_00->work).length);
      if (iVar1 != 0) {
        return -0x1e;
      }
      (shar_00->work).length = 0;
    }
  }
  return -0x1e;
}

Assistant:

static ssize_t
archive_write_shar_data_uuencode(struct archive_write *a, const void *buff,
    size_t length)
{
	struct shar *shar;
	const char *src;
	size_t n;
	int ret;

	shar = (struct shar *)a->format_data;
	if (!shar->has_data)
		return (ARCHIVE_OK);
	src = (const char *)buff;

	if (shar->outpos != 0) {
		n = 45 - shar->outpos;
		if (n > length)
			n = length;
		memcpy(shar->outbuff + shar->outpos, src, n);
		if (shar->outpos + n < 45) {
			shar->outpos += n;
			return length;
		}
		uuencode_line(a, shar, shar->outbuff, 45);
		src += n;
		n = length - n;
	} else {
		n = length;
	}

	while (n >= 45) {
		uuencode_line(a, shar, src, 45);
		src += 45;
		n -= 45;

		if (shar->work.length < 65536)
			continue;
		ret = __archive_write_output(a, shar->work.s,
		    shar->work.length);
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		archive_string_empty(&shar->work);
	}
	if (n != 0) {
		memcpy(shar->outbuff, src, n);
		shar->outpos = n;
	}
	return (length);
}